

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFObjectHandle.cc
# Opt level: O1

void __thiscall
QPDFObjectHandle::addContentTokenFilter
          (QPDFObjectHandle *this,shared_ptr<QPDFObjectHandle::TokenFilter> *filter)

{
  shared_ptr<QPDFObjectHandle::TokenFilter> local_60;
  QPDFObjectHandle local_50;
  long *local_40 [2];
  long local_30 [2];
  
  coalesceContentStreams(this);
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"/Contents","");
  getKey(&local_50,(string *)this);
  local_60.super___shared_ptr<QPDFObjectHandle::TokenFilter,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (filter->super___shared_ptr<QPDFObjectHandle::TokenFilter,_(__gnu_cxx::_Lock_policy)2>).
       _M_ptr;
  local_60.super___shared_ptr<QPDFObjectHandle::TokenFilter,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (filter->super___shared_ptr<QPDFObjectHandle::TokenFilter,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  if (local_60.super___shared_ptr<QPDFObjectHandle::TokenFilter,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_60.super___shared_ptr<QPDFObjectHandle::TokenFilter,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_60.super___shared_ptr<QPDFObjectHandle::TokenFilter,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_60.super___shared_ptr<QPDFObjectHandle::TokenFilter,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_60.super___shared_ptr<QPDFObjectHandle::TokenFilter,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  addTokenFilter(&local_50,&local_60);
  if (local_60.super___shared_ptr<QPDFObjectHandle::TokenFilter,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.
               super___shared_ptr<QPDFObjectHandle::TokenFilter,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_50.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_50.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  return;
}

Assistant:

void
QPDFObjectHandle::addContentTokenFilter(std::shared_ptr<TokenFilter> filter)
{
    coalesceContentStreams();
    this->getKey("/Contents").addTokenFilter(filter);
}